

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O3

UniquePtr<struct_stack_st_X509> __thiscall
anon_unknown.dwarf_b3fcdf::CertsToStack
          (anon_unknown_dwarf_b3fcdf *this,vector<x509_st_*,_std::allocator<x509_st_*>_> *certs)

{
  pointer ppxVar1;
  _Head_base<0UL,_x509_st_*,_false> x;
  _Head_base<0UL,_stack_st_X509_*,_false> sk;
  size_t sVar2;
  UniquePtr<struct_stack_st_X509> extraout_RAX;
  pointer ppxVar3;
  UniquePtr<struct_stack_st_X509> stack;
  _Head_base<0UL,_stack_st_X509_*,_false> local_40;
  __uniq_ptr_impl<x509_st,_bssl::internal::Deleter> local_38;
  
  local_40._M_head_impl = (stack_st_X509 *)OPENSSL_sk_new_null();
  if ((OPENSSL_STACK *)local_40._M_head_impl == (OPENSSL_STACK *)0x0) {
LAB_00396174:
    *(undefined8 *)this = 0;
  }
  else {
    ppxVar3 = (certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppxVar1 = (certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppxVar3 != ppxVar1) {
      do {
        sk._M_head_impl = local_40._M_head_impl;
        x._M_head_impl = *ppxVar3;
        if ((_Head_base<0UL,_x509_st_*,_false>)x._M_head_impl !=
            (_Head_base<0UL,_x509_st_*,_false>)0x0) {
          X509_up_ref(x._M_head_impl);
        }
        local_38._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (tuple<x509_st_*,_bssl::internal::Deleter>)
             (tuple<x509_st_*,_bssl::internal::Deleter>)x._M_head_impl;
        sVar2 = OPENSSL_sk_push((OPENSSL_STACK *)sk._M_head_impl,x._M_head_impl);
        if (sVar2 == 0) {
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_38);
          goto LAB_00396174;
        }
        local_38._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (tuple<x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)0x0;
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_38);
        ppxVar3 = ppxVar3 + 1;
      } while (ppxVar3 != ppxVar1);
    }
    *(stack_st_X509 **)this = local_40._M_head_impl;
    local_40._M_head_impl = (stack_st_X509 *)0x0;
  }
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&local_40);
  return (UniquePtr<struct_stack_st_X509>)
         extraout_RAX._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<STACK_OF(X509)> CertsToStack(
    const std::vector<X509 *> &certs) {
  bssl::UniquePtr<STACK_OF(X509)> stack(sk_X509_new_null());
  if (!stack) {
    return nullptr;
  }
  for (auto cert : certs) {
    if (!bssl::PushToStack(stack.get(), bssl::UpRef(cert))) {
      return nullptr;
    }
  }

  return stack;
}